

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall Gecko::Graph::swap(Graph *this,uint k,uint l)

{
  float fVar1;
  uint uVar2;
  pointer puVar3;
  pointer pNVar4;
  float fVar5;
  
  puVar3 = (this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = puVar3[k];
  puVar3[k] = puVar3[l];
  puVar3[l] = uVar2;
  pNVar4 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar5 = pNVar4[uVar2].pos - pNVar4[uVar2].hlen;
  do {
    fVar1 = pNVar4[puVar3[k]].hlen;
    fVar5 = fVar5 + fVar1;
    pNVar4[puVar3[k]].pos = fVar5;
    fVar5 = fVar5 + fVar1;
    k = k + 1;
  } while (l + 1 != k);
  return;
}

Assistant:

void
Graph::swap(uint k, uint l)
{
  Node::Index i = perm[k];
  perm[k] = perm[l];
  perm[l] = i;
  Float p = node[i].pos - node[i].hlen;
  do {
    i = perm[k];
    p += node[i].hlen;
    node[i].pos = p;
    p += node[i].hlen;
  } while (k++ != l);
}